

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedNumberFormat::format
          (RuleBasedNumberFormat *this,double number,NFRuleSet *rs,UnicodeString *toAppendTo,
          UErrorCode *status)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  RoundingMode roundingMode;
  int32_t iVar5;
  DecimalQuantity digitList;
  double local_88;
  DecimalQuantity local_80;
  
  sVar1 = (toAppendTo->fUnion).fStackFields.fLengthAndFlags;
  iVar5 = (toAppendTo->fUnion).fFields.fLength;
  iVar3 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x22])();
  local_88 = number;
  if (iVar3 != 7) {
    UVar2 = uprv_isNaN_63(number);
    if (UVar2 == '\0') {
      UVar2 = uprv_isInfinite_63(number);
      if (UVar2 == '\0') {
        icu_63::number::impl::DecimalQuantity::DecimalQuantity(&local_80);
        icu_63::number::impl::DecimalQuantity::setToDouble(&local_80,number);
        iVar4 = NumberFormat::getMaximumFractionDigits(&this->super_NumberFormat);
        roundingMode = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x22])
                                 (this);
        icu_63::number::impl::DecimalQuantity::roundToMagnitude
                  (&local_80,-iVar4,roundingMode,status);
        local_88 = icu_63::number::impl::DecimalQuantity::toDouble(&local_80);
        icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&local_80);
      }
    }
  }
  iVar4 = (int)sVar1 >> 5;
  if (sVar1 < 0) {
    iVar4 = iVar5;
  }
  sVar1 = (toAppendTo->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (toAppendTo->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  NFRuleSet::format(rs,local_88,toAppendTo,iVar5,0,status);
  adjustForCapitalizationContext(this,iVar4,toAppendTo,status);
  return;
}

Assistant:

void
RuleBasedNumberFormat::format(double number,
                              NFRuleSet& rs,
                              UnicodeString& toAppendTo,
                              UErrorCode& status) const
{
    int32_t startPos = toAppendTo.length();
    if (getRoundingMode() != DecimalFormat::ERoundingMode::kRoundUnnecessary && !uprv_isNaN(number) && !uprv_isInfinite(number)) {
        DecimalQuantity digitList;
        digitList.setToDouble(number);
        digitList.roundToMagnitude(
                -getMaximumFractionDigits(),
                static_cast<UNumberFormatRoundingMode>(getRoundingMode()),
                status);
        number = digitList.toDouble();
    }
    rs.format(number, toAppendTo, toAppendTo.length(), 0, status);
    adjustForCapitalizationContext(startPos, toAppendTo, status);
}